

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O1

bool __thiscall Sandbox::haveChange(Sandbox *this)

{
  bool bVar1;
  int iVar2;
  
  if (this->m_change == false) {
    bVar1 = isRecording();
    if (!bVar1) {
      iVar2 = std::__cxx11::string::compare((char *)&this->screenshotFile);
      if (iVar2 == 0) {
        bVar1 = SceneRender::haveChange(&this->m_sceneRender);
        if (!bVar1) {
          bVar1 = Uniforms::haveChange(&this->uniforms);
          return bVar1;
        }
      }
    }
  }
  return true;
}

Assistant:

bool Sandbox::haveChange() { 
    return  m_change ||
            isRecording() ||
            screenshotFile != "" ||
            m_sceneRender.haveChange() ||
            uniforms.haveChange();
}